

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O2

int AF_ABridgeBall_A_BridgeOrbit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AActor *self;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004a7444;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004a7444;
        }
        goto LAB_004a7428;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_004a7434;
    self = (AActor *)0x0;
LAB_004a7428:
    BridgeOrbit(self);
    return 0;
  }
LAB_004a7434:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004a7444:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                ,0x77,
                "int AF_ABridgeBall_A_BridgeOrbit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(ABridgeBall, A_BridgeOrbit)
{
	PARAM_SELF_PROLOGUE(AActor);
	BridgeOrbit(self);
	return 0;
}